

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_close_with_pending_event(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined8 uVar4;
  int in_ECX;
  int extraout_EDX;
  long lVar5;
  uv_loop_t **__s1;
  uv_fs_event_t *puVar6;
  int64_t eval_b;
  int64_t eval_a;
  char acStack_700 [24];
  char *apcStack_6e8 [15];
  undefined1 auStack_670 [104];
  undefined8 uStack_608;
  uv_fs_event_t *puStack_600;
  long lStack_5f8;
  long lStack_5f0;
  code *pcStack_5e8;
  long lStack_5e0;
  long lStack_5d8;
  code *pcStack_5d0;
  size_t sStack_5c0;
  size_t sStack_5b8;
  size_t sStack_5b0;
  char acStack_5a8 [1032];
  undefined8 uStack_1a0;
  uv_fs_event_t uStack_150;
  undefined1 auStack_d8 [104];
  undefined8 uStack_70;
  
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_file("watch_dir/file");
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    if (iVar2 != 0) goto LAB_0018925a;
    touch_file("watch_dir/file");
    uv_close(&fs_event,close_cb);
    uv_run(uVar3,0);
    if (close_cb_called != 1) goto LAB_00189267;
    remove("watch_dir/file");
    remove("watch_dir/");
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0018925a:
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00189267:
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  run_test_fs_event_close_with_pending_event_cold_4();
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_file("watch_dir/file");
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file");
    if (iVar2 != 0) goto LAB_001893ca;
    remove("watch_dir/file");
    uv_sleep(0x44c);
    uv_update_time(uVar3);
    uv_close(&fs_event,close_cb);
    uv_run(uVar3,0);
    if (close_cb_called != 1) goto LAB_001893d7;
    remove("watch_dir/");
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_001893ca:
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_001893d7:
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  uVar3 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  if (iVar2 == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    if (iVar2 != 0) goto LAB_001895b7;
    iVar2 = uv_timer_init(uVar3,&timer);
    if (iVar2 != 0) goto LAB_001895c4;
    in_ECX = 0;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100);
    if (iVar2 != 0) goto LAB_001895d1;
    uv_run(uVar3,0);
    uv_close(&timer,close_cb);
    uv_run(uVar3,1);
    if (close_cb_called != 2) goto LAB_001895de;
    if (fs_event_cb_called != 3) goto LAB_001895eb;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/");
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_close_in_callback_cold_1();
LAB_001895b7:
    run_test_fs_event_close_in_callback_cold_2();
LAB_001895c4:
    run_test_fs_event_close_in_callback_cold_3();
LAB_001895d1:
    run_test_fs_event_close_in_callback_cold_4();
LAB_001895de:
    run_test_fs_event_close_in_callback_cold_5();
LAB_001895eb:
    run_test_fs_event_close_in_callback_cold_6();
  }
  run_test_fs_event_close_in_callback_cold_7();
  if (in_ECX == 0) {
    in_ECX = fs_event_cb_called;
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        iVar2 = uv_close();
        return iVar2;
      }
      return fs_event_cb_called;
    }
  }
  else {
    fs_event_cb_close_cold_1();
  }
  fs_event_cb_close_cold_2();
  uStack_70 = uVar3;
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar3,auStack_d8);
  uStack_150._16_8_ = SEXT48(iVar2);
  uStack_150.data = (uv_loop_t *)0x0;
  if (uStack_150._16_8_ == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(auStack_d8,fs_event_cb_dir,"watch_dir");
    uStack_150._16_8_ = SEXT48(iVar2);
    uStack_150.data = (uv_loop_t *)0x0;
    if (uStack_150._16_8_ != 0) goto LAB_00189838;
    iVar2 = uv_fs_event_init(uVar3,&uStack_150.type);
    uStack_150.data = (void *)(long)iVar2;
    uStack_150.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_150.data != (uv_loop_t *)0x0) goto LAB_00189847;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_150.type,fs_event_cb_dir,"watch_dir");
    uStack_150.data = (void *)(long)iVar2;
    uStack_150.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_150.data != (uv_loop_t *)0x0) goto LAB_00189856;
    uv_close(&uStack_150.type,close_cb);
    uv_close(auStack_d8,close_cb);
    uv_run(uVar3,0);
    uStack_150.data = (uv_loop_t *)0x2;
    uStack_150.loop = (uv_loop_t *)(long)close_cb_called;
    if (uStack_150.loop != (uv_loop_t *)0x2) goto LAB_00189865;
    remove("watch_dir/");
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uStack_150.data = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(uVar3);
    uStack_150.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)uStack_150.data == uStack_150.loop) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00189838:
    run_test_fs_event_start_and_close_cold_2();
LAB_00189847:
    run_test_fs_event_start_and_close_cold_3();
LAB_00189856:
    run_test_fs_event_start_and_close_cold_4();
LAB_00189865:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar6 = &uStack_150;
  __s1 = &uStack_150.loop;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    if (in_ECX != 0) goto LAB_00189951;
    if (extraout_EDX != 2) goto LAB_00189960;
    iVar2 = strcmp((char *)__s1,"file1");
    if (iVar2 != 0) goto LAB_0018996f;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      iVar2 = uv_close(&fs_event,close_cb);
      return iVar2;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00189951:
    fs_event_cb_dir_cold_2();
LAB_00189960:
    fs_event_cb_dir_cold_3();
LAB_0018996f:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  pcStack_5d0 = (code *)0x1899a3;
  uStack_1a0 = uVar3;
  uVar3 = uv_default_loop();
  pcStack_5d0 = (code *)0x1899b2;
  create_dir("watch_dir");
  pcStack_5d0 = (code *)0x1899be;
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  sVar1 = sStack_5c0;
  do {
    sStack_5c0 = sVar1;
    pcStack_5d0 = (code *)0x1899dc;
    iVar2 = uv_fs_event_init(uVar3,&fs_event);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0;
    if (sStack_5b8 != 0) {
LAB_00189ccc:
      pcStack_5d0 = (code *)0x189cdb;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00189cdb;
    }
    sStack_5b0 = 0x400;
    pcStack_5d0 = (code *)0x189a13;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_5a8,&sStack_5b0);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0xffffffffffffffea;
    if (sStack_5b8 != 0xffffffffffffffea) {
LAB_00189cbd:
      pcStack_5d0 = (code *)0x189ccc;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00189ccc;
    }
    __s = *(char **)((long)&DAT_0024dc50 + lVar5);
    pcStack_5d0 = (code *)0x189a53;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0;
    if (sStack_5b8 != 0) {
LAB_00189cae:
      pcStack_5d0 = (code *)0x189cbd;
      run_test_fs_event_getpath_cold_3();
      goto LAB_00189cbd;
    }
    sStack_5b0 = 0;
    pcStack_5d0 = (code *)0x189a8a;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_5a8,&sStack_5b0);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0xffffffffffffff97;
    if (sStack_5b8 != 0xffffffffffffff97) {
LAB_00189c9f:
      pcStack_5d0 = (code *)0x189cae;
      run_test_fs_event_getpath_cold_4();
      goto LAB_00189cae;
    }
    sStack_5b8 = sStack_5b0;
    sStack_5c0 = 0x400;
    if (0x3ff < (long)sStack_5b0) {
LAB_00189c90:
      pcStack_5d0 = (code *)0x189c9f;
      run_test_fs_event_getpath_cold_5();
      goto LAB_00189c9f;
    }
    pcStack_5d0 = (code *)0x189ada;
    sStack_5c0 = strlen(__s);
    sStack_5c0 = sStack_5c0 + 1;
    if (sStack_5b8 != sStack_5c0) {
LAB_00189c81:
      pcStack_5d0 = (code *)0x189c90;
      run_test_fs_event_getpath_cold_6();
      goto LAB_00189c90;
    }
    pcStack_5d0 = (code *)0x189b00;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_5a8,&sStack_5b0);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0;
    if (sStack_5b8 != 0) {
LAB_00189c72:
      pcStack_5d0 = (code *)0x189c81;
      run_test_fs_event_getpath_cold_7();
      goto LAB_00189c81;
    }
    sStack_5b8 = sStack_5b0;
    pcStack_5d0 = (code *)0x189b32;
    sStack_5c0 = strlen(__s);
    if (sStack_5b8 != sStack_5c0) {
LAB_00189c63:
      pcStack_5d0 = (code *)0x189c72;
      run_test_fs_event_getpath_cold_8();
      goto LAB_00189c72;
    }
    pcStack_5d0 = (code *)0x189b52;
    iVar2 = strcmp(acStack_5a8,__s);
    if (iVar2 != 0) {
LAB_00189c5e:
      pcStack_5d0 = (code *)0x189c63;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00189c63;
    }
    pcStack_5d0 = (code *)0x189b62;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_5b8 = (size_t)iVar2;
    sStack_5c0 = 0;
    if (sStack_5b8 != 0) {
LAB_00189c4f:
      pcStack_5d0 = (code *)0x189c5e;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00189c5e;
    }
    pcStack_5d0 = (code *)0x189b91;
    uv_close(&fs_event,close_cb);
    pcStack_5d0 = (code *)0x189b9b;
    uv_run(uVar3,0);
    sStack_5b8 = 1;
    sStack_5c0 = (size_t)close_cb_called;
    if (sStack_5c0 != 1) {
      pcStack_5d0 = (code *)0x189c4f;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00189c4f;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
    sVar1 = 1;
  } while (lVar5 != 0x28);
  pcStack_5d0 = (code *)0x189be4;
  remove("watch_dir/");
  pcStack_5d0 = (code *)0x189bf5;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_5d0 = (code *)0x189bff;
  uv_run(uVar3,0);
  sStack_5b8 = 0;
  pcStack_5d0 = (code *)0x189c10;
  iVar2 = uv_loop_close(uVar3);
  sStack_5c0 = (size_t)iVar2;
  if (sStack_5b8 == sStack_5c0) {
    pcStack_5d0 = (code *)0x189c2c;
    uv_library_shutdown();
    return 0;
  }
LAB_00189cdb:
  pcStack_5d0 = run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  pcStack_5e8 = (code *)0x189cf4;
  pcStack_5d0 = (code *)uVar3;
  uVar3 = uv_default_loop();
  pcStack_5e8 = (code *)0x189d08;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_5e8 = (code *)0x189d12;
  uv_run(uVar3,0);
  lStack_5d8 = 0;
  pcStack_5e8 = (code *)0x189d20;
  uVar4 = uv_default_loop();
  pcStack_5e8 = (code *)0x189d28;
  iVar2 = uv_loop_close(uVar4);
  lStack_5e0 = (long)iVar2;
  if (lStack_5d8 == lStack_5e0) {
    pcStack_5e8 = (code *)0x189d3e;
    uv_library_shutdown();
    return 0;
  }
  pcStack_5e8 = run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_600 = (uv_fs_event_t *)0x189d5d;
  pcStack_5e8 = (code *)uVar3;
  uVar3 = uv_default_loop();
  puStack_600 = (uv_fs_event_t *)0x189d6f;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  lStack_5f0 = (long)iVar2;
  lStack_5f8 = 0;
  if (lStack_5f0 == 0) {
    puStack_600 = (uv_fs_event_t *)0x189da9;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_00189e7c;
    puStack_600 = (uv_fs_event_t *)0x189dbd;
    iVar2 = uv_is_active(&fs_event);
    lStack_5f0 = (long)iVar2;
    lStack_5f8 = 0;
    if (lStack_5f0 != 0) goto LAB_00189e81;
    puStack_600 = (uv_fs_event_t *)0x189df7;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_00189e8e;
    puStack_600 = (uv_fs_event_t *)0x189e0b;
    iVar2 = uv_is_active(&fs_event);
    lStack_5f0 = (long)iVar2;
    lStack_5f8 = 0;
    if (lStack_5f0 != 0) goto LAB_00189e93;
    puStack_600 = (uv_fs_event_t *)0x189e36;
    uv_walk(uVar3,close_walk_cb,0);
    puStack_600 = (uv_fs_event_t *)0x189e40;
    uv_run(uVar3,0);
    lStack_5f0 = 0;
    puStack_600 = (uv_fs_event_t *)0x189e51;
    iVar2 = uv_loop_close(uVar3);
    lStack_5f8 = (long)iVar2;
    if (lStack_5f0 == lStack_5f8) {
      puStack_600 = (uv_fs_event_t *)0x189e67;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_600 = (uv_fs_event_t *)0x189e7c;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00189e7c:
    puStack_600 = (uv_fs_event_t *)0x189e81;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00189e81:
    puStack_600 = (uv_fs_event_t *)0x189e8e;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00189e8e:
    puStack_600 = (uv_fs_event_t *)0x189e93;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_00189e93:
    puStack_600 = (uv_fs_event_t *)0x189ea0;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_600 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_600 = &fs_event;
  builtin_strncpy(acStack_700,"fs_event_stop_in_cb.txt",0x18);
  uStack_608 = uVar3;
  remove(acStack_700);
  create_file(acStack_700);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(uVar3,auStack_670);
  apcStack_6e8[0] = (char *)(long)iVar2;
  if (apcStack_6e8[0] == (char *)0x0) {
    iVar2 = uv_fs_event_start(auStack_670,fs_event_cb_stop,acStack_700,0);
    apcStack_6e8[0] = (char *)(long)iVar2;
    if (apcStack_6e8[0] != (char *)0x0) goto LAB_0018a14e;
    apcStack_6e8[0] = acStack_700;
    uVar3 = uv_default_loop();
    iVar2 = uv_timer_init(uVar3,apcStack_6e8);
    if (iVar2 != 0) goto LAB_0018a15b;
    iVar2 = uv_timer_start(apcStack_6e8,timer_cb_touch,100,0);
    if (iVar2 != 0) goto LAB_0018a168;
    if (fs_event_cb_stop_calls != 0) goto LAB_0018a175;
    if (timer_cb_touch_called != 0) goto LAB_0018a182;
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0018a18f;
    if (fs_event_cb_stop_calls != 1) goto LAB_0018a19c;
    if (timer_cb_touch_called != 1) goto LAB_0018a1a9;
    uv_close(auStack_670,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0018a1b6;
    if (fs_event_cb_stop_calls == 1) {
      remove(acStack_700);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018a1d0;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018a14e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018a15b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_0018a168:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_0018a175:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_0018a182:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_0018a18f:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_0018a19c:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_0018a1a9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_0018a1b6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_0018a1d0:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop();
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_close_with_pending_event) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");
  create_file("watch_dir/file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_fail, "watch_dir", 0);
  ASSERT_OK(r);

  /* Generate an fs event. */
  touch_file("watch_dir/file");

  uv_close((uv_handle_t*)&fs_event, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  /* Clean up */
  remove("watch_dir/file");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}